

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setPushConstantRanges
          (ShaderRenderCaseInstance *this,deUint32 rangeCount,VkPushConstantRange *pcRanges)

{
  uint local_24;
  deUint32 i;
  VkPushConstantRange *pcRanges_local;
  deUint32 rangeCount_local;
  ShaderRenderCaseInstance *this_local;
  
  std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::clear
            (&this->m_pushConstantRanges);
  for (local_24 = 0; local_24 < rangeCount; local_24 = local_24 + 1) {
    std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::push_back
              (&this->m_pushConstantRanges,pcRanges + local_24);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setPushConstantRanges (const deUint32 rangeCount, const vk::VkPushConstantRange* const pcRanges)
{
	m_pushConstantRanges.clear();
	for (deUint32 i = 0; i < rangeCount; ++i)
	{
		m_pushConstantRanges.push_back(pcRanges[i]);
	}
}